

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

JsTypeValueInfo * __thiscall
GlobOptBlockData::MergeJsTypeValueInfo
          (GlobOptBlockData *this,JsTypeValueInfo *toValueInfo,JsTypeValueInfo *fromValueInfo,
          bool isLoopBackEdge,bool sameValueNumber)

{
  EquivalentTypeSet *left;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  LocalFunctionId functionId;
  EquivalentTypeSet *value;
  JITTypeHolderBase<void> local_68;
  JITTypeHolder fromType;
  JITTypeHolderBase<void> local_50;
  JITTypeHolder toType;
  JITTypeHolderBase<void> local_38;
  JITTypeHolder mergedType;
  
  if (isLoopBackEdge && !sameValueNumber) {
LAB_00464118:
    toValueInfo = (JsTypeValueInfo *)0x0;
  }
  else {
    if (toValueInfo == fromValueInfo) {
      return toValueInfo;
    }
    local_50.t = (toValueInfo->jsType).t;
    local_68.t = (fromValueInfo->jsType).t;
    bVar1 = JITTypeHolderBase<void>::operator==(&local_50,&local_68);
    if (bVar1) {
      local_38.t = local_50.t;
    }
    else {
      JITTypeHolderBase<void>::JITTypeHolderBase(&local_38,(JITType *)0x0);
    }
    left = toValueInfo->jsTypeSet;
    if (fromValueInfo->jsTypeSet == (EquivalentTypeSet *)0x0 || left == (EquivalentTypeSet *)0x0) {
      value = (EquivalentTypeSet *)0x0;
    }
    else {
      bVar1 = Js::EquivalentTypeSet::AreIdentical(left,fromValueInfo->jsTypeSet);
      value = (EquivalentTypeSet *)0x0;
      if (bVar1) {
        value = left;
      }
    }
    uVar2 = Func::GetSourceContextId(this->globOpt->func);
    uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar2,uVar3);
    if (bVar1) {
LAB_0046406b:
      Output::Print(L"ObjTypeSpec: Merging type value info:\n");
      Output::Print(L"    from (shared %d): ",(ulong)fromValueInfo->isShared);
      ValueInfo::Dump(&fromValueInfo->super_ValueInfo);
      Output::Print(L"\n    to (shared %d): ",(ulong)toValueInfo->isShared);
      ValueInfo::Dump(&toValueInfo->super_ValueInfo);
    }
    else {
      toType.t._4_4_ = Func::GetSourceContextId(this->globOpt->func);
      uVar2 = Func::GetLocalFunctionId(this->globOpt->func);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,toType.t._4_4_,uVar2);
      if (bVar1) goto LAB_0046406b;
    }
    bVar1 = JITTypeHolderBase<void>::operator==(&local_38,&local_50);
    if ((value == left) && (bVar1)) {
      uVar2 = Func::GetSourceContextId(this->globOpt->func);
      functionId = Func::GetLocalFunctionId(this->globOpt->func);
    }
    else {
      fromType.t = (Type)0x0;
      bVar1 = JITTypeHolderBase<void>::operator==(&local_38,&fromType.t);
      if ((value == (EquivalentTypeSet *)0x0) && (bVar1)) goto LAB_00464118;
      if (toValueInfo->isShared == true) {
        toValueInfo = JsTypeValueInfo::New(this->globOpt->alloc,(JITTypeHolder)local_38.t,value);
      }
      else {
        JsTypeValueInfo::SetJsType(toValueInfo,(JITTypeHolder)local_38.t);
        JsTypeValueInfo::SetJsTypeSet(toValueInfo,value);
      }
      uVar2 = Func::GetSourceContextId(this->globOpt->func);
      functionId = Func::GetLocalFunctionId(this->globOpt->func);
    }
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar2,functionId);
    if (!bVar1) {
      uVar2 = Func::GetSourceContextId(this->globOpt->func);
      uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,EquivObjTypeSpecPhase,uVar2,uVar3);
      if (!bVar1) {
        return toValueInfo;
      }
    }
    Output::Print(L"\n    result (shared %d): ",(ulong)toValueInfo->isShared);
    ValueInfo::Dump(&toValueInfo->super_ValueInfo);
    Output::Print(L"\n");
  }
  return toValueInfo;
}

Assistant:

JsTypeValueInfo*
GlobOptBlockData::MergeJsTypeValueInfo(JsTypeValueInfo * toValueInfo, JsTypeValueInfo * fromValueInfo, bool isLoopBackEdge, bool sameValueNumber)
{
    // On loop back edges we must be conservative and only consider type values which are invariant throughout the loop.
    // That's because in dead store pass we can't correctly track object pointer assignments (o = p), and we may not
    // be able to register correct type checks for the right properties upstream. If we ever figure out how to enhance
    // the dead store pass to track this info we could go more aggressively, as below.
    if (isLoopBackEdge && !sameValueNumber)
    {
        return nullptr;
    }

    if (toValueInfo == fromValueInfo)
    {
        return toValueInfo;
    }

    const JITTypeHolder toType = toValueInfo->GetJsType();
    const JITTypeHolder fromType = fromValueInfo->GetJsType();
    const JITTypeHolder mergedType = toType == fromType ? toType : JITTypeHolder(nullptr);

    Js::EquivalentTypeSet* toTypeSet = toValueInfo->GetJsTypeSet();
    Js::EquivalentTypeSet* fromTypeSet = fromValueInfo->GetJsTypeSet();
    Js::EquivalentTypeSet* mergedTypeSet = (toTypeSet != nullptr && fromTypeSet != nullptr && Js::EquivalentTypeSet::AreIdentical(toTypeSet, fromTypeSet)) ? toTypeSet : nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
    {
        Output::Print(_u("ObjTypeSpec: Merging type value info:\n"));
        Output::Print(_u("    from (shared %d): "), fromValueInfo->GetIsShared());
        fromValueInfo->Dump();
        Output::Print(_u("\n    to (shared %d): "), toValueInfo->GetIsShared());
        toValueInfo->Dump();
    }
#endif

    if (mergedType == toType && mergedTypeSet == toTypeSet)
    {
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), toValueInfo->GetIsShared());
            toValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return toValueInfo;
    }

    if (mergedType == nullptr && mergedTypeSet == nullptr)
    {
        // No info, so don't bother making a value.
        return nullptr;
    }

    if (toValueInfo->GetIsShared())
    {
        JsTypeValueInfo* mergedValueInfo = JsTypeValueInfo::New(this->globOpt->alloc, mergedType, mergedTypeSet);
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), mergedValueInfo->GetIsShared());
            mergedValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return mergedValueInfo;
    }
    else
    {
        toValueInfo->SetJsType(mergedType);
        toValueInfo->SetJsTypeSet(mergedTypeSet);
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), toValueInfo->GetIsShared());
            toValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return toValueInfo;
    }
}